

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strbuf.c
# Opt level: O2

strbuf * strbuf_new_for_agent_query(void)

{
  strbuf *buf_o;
  
  buf_o = strbuf_new();
  strbuf_append(buf_o,4);
  return buf_o;
}

Assistant:

strbuf *strbuf_new_for_agent_query(void)
{
    strbuf *buf = strbuf_new();
    strbuf_append(buf, 4);
    return buf;
}